

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_oneof.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::OneofGenerator::GenerateCaseEnum
          (OneofGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  pointer pcVar1;
  objectivec *this_00;
  mapped_type *pmVar2;
  OneofDescriptor *pOVar3;
  int i;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *field;
  long lVar4;
  string field_name;
  string enum_name;
  string local_50;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,"typedef GPB_ENUM($enum_name$) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,variables,"$enum_name$_GPBUnsetOneOfCase = 0,\n");
  field_name._M_dataplus._M_p = (pointer)&field_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&field_name,"enum_name","");
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&field_name);
  enum_name._M_dataplus._M_p = (pointer)&enum_name.field_2;
  pcVar1 = (pmVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&enum_name,pcVar1,pcVar1 + pmVar2->_M_string_length);
  field = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_name._M_dataplus._M_p != &field_name.field_2) {
    operator_delete(field_name._M_dataplus._M_p,field_name.field_2._M_allocated_capacity + 1);
    field = extraout_RDX_00;
  }
  pOVar3 = this->descriptor_;
  if (0 < *(int *)(pOVar3 + 0x1c)) {
    lVar4 = 0;
    do {
      this_00 = *(objectivec **)(*(long *)(pOVar3 + 0x20) + lVar4 * 8);
      FieldNameCapitalized_abi_cxx11_(&field_name,this_00,field);
      SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)*(uint *)(this_00 + 0x38),i);
      io::Printer::Print(printer,"$enum_name$_$field_name$ = $field_number$,\n","enum_name",
                         &enum_name,"field_name",&field_name,"field_number",&local_50);
      field = extraout_RDX_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        field = extraout_RDX_02;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)field_name._M_dataplus._M_p != &field_name.field_2) {
        operator_delete(field_name._M_dataplus._M_p,field_name.field_2._M_allocated_capacity + 1);
        field = extraout_RDX_03;
      }
      lVar4 = lVar4 + 1;
      pOVar3 = this->descriptor_;
    } while (lVar4 < *(int *)(pOVar3 + 0x1c));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"};\n\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)enum_name._M_dataplus._M_p != &enum_name.field_2) {
    operator_delete(enum_name._M_dataplus._M_p,enum_name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void OneofGenerator::GenerateCaseEnum(io::Printer* printer) {
  printer->Print(
      variables_,
      "typedef GPB_ENUM($enum_name$) {\n");
  printer->Indent();
  printer->Print(
      variables_,
      "$enum_name$_GPBUnsetOneOfCase = 0,\n");
  string enum_name = variables_["enum_name"];
  for (int j = 0; j < descriptor_->field_count(); j++) {
    const FieldDescriptor* field = descriptor_->field(j);
    string field_name = FieldNameCapitalized(field);
    printer->Print(
        "$enum_name$_$field_name$ = $field_number$,\n",
        "enum_name", enum_name,
        "field_name", field_name,
        "field_number", SimpleItoa(field->number()));
  }
  printer->Outdent();
  printer->Print(
      "};\n"
      "\n");
}